

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O1

void assert_wait_child(pid_t child_pid)

{
  uint uVar1;
  int iVar2;
  uint child_pid_00;
  __pid_t child_pid_01;
  ssize_t sVar3;
  undefined1 *puVar4;
  undefined8 uVar5;
  uint extraout_EDX;
  uint uVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  int child_stat;
  undefined1 uStack_1b1;
  int iStack_1b0;
  int iStack_1ac;
  int iStack_1a8;
  int iStack_1a4;
  undefined1 auStack_1a0 [160];
  code *pcStack_100;
  undefined1 *puStack_f0;
  code *pcStack_e8;
  int iStack_d8;
  uint uStack_d4;
  undefined1 auStack_d0 [160];
  code *pcStack_30;
  uint local_1c;
  
  puVar4 = (undefined1 *)(ulong)(uint)child_pid;
  pcStack_30 = (code *)0x14eeb2;
  uVar1 = waitpid(child_pid,(int *)&local_1c,0);
  pcStack_30 = (code *)0x14eec7;
  printf("Waited pid is %d with status %d\n",(ulong)uVar1,(ulong)local_1c);
  if (uVar1 == 0xffffffff) {
    pcStack_30 = (code *)0x14eef4;
    perror("Failed to wait");
  }
  if (uVar1 == child_pid) {
    if ((local_1c & 0x7f) != 0) goto LAB_0014eefb;
    if ((local_1c & 0xff00) == 0) {
      return;
    }
  }
  else {
    pcStack_30 = (code *)0x14eefb;
    assert_wait_child_cold_1();
LAB_0014eefb:
    pcStack_30 = (code *)0x14ef00;
    assert_wait_child_cold_2();
  }
  pcStack_30 = run_test_fork_socketpair;
  assert_wait_child_cold_3();
  pcStack_e8 = (code *)0x14ef12;
  pcStack_30 = (code *)puVar4;
  run_timer_loop_once();
  puVar8 = (undefined1 *)0x1;
  uVar6 = 1;
  pcStack_e8 = (code *)0x14ef28;
  iVar2 = socketpair(1,1,0,&iStack_d8);
  if (iVar2 == 0) {
    pcStack_e8 = (code *)0x14ef35;
    puVar8 = (undefined1 *)uv_default_loop();
    puVar7 = auStack_d0;
    pcStack_e8 = (code *)0x14ef46;
    iVar2 = uv_poll_init(puVar8,puVar7,iStack_d8);
    uVar6 = (uint)puVar7;
    if (iVar2 != 0) goto LAB_0014f038;
    pcStack_e8 = (code *)0x14ef53;
    child_pid_00 = fork();
    if (child_pid_00 != 0) {
      puVar4 = (undefined1 *)(ulong)child_pid_00;
      if (child_pid_00 == 0xffffffff) goto LAB_0014f042;
      puVar8 = (undefined1 *)(ulong)uStack_d4;
      uVar6 = 0x18271a;
      pcStack_e8 = (code *)0x14ef79;
      sVar3 = send(uStack_d4,"hi\n",3,0);
      if (sVar3 == 3) {
        pcStack_e8 = (code *)0x14ef8a;
        assert_wait_child(child_pid_00);
LAB_0014eff4:
        pcStack_e8 = (code *)0x14eff9;
        puVar4 = (undefined1 *)uv_default_loop();
        pcStack_e8 = (code *)0x14f00d;
        uv_walk(puVar4,close_walk_cb,0);
        uVar6 = 0;
        pcStack_e8 = (code *)0x14f017;
        uv_run(puVar4);
        pcStack_e8 = (code *)0x14f01c;
        puVar8 = (undefined1 *)uv_default_loop();
        pcStack_e8 = (code *)0x14f024;
        iVar2 = uv_loop_close();
        if (iVar2 == 0) {
          return;
        }
        goto LAB_0014f03d;
      }
      goto LAB_0014f047;
    }
    pcStack_e8 = (code *)0x14ef91;
    puVar8 = (undefined1 *)uv_default_loop();
    pcStack_e8 = (code *)0x14ef99;
    iVar2 = uv_loop_fork();
    if (iVar2 != 0) goto LAB_0014f04c;
    if (socket_cb_called != 0) goto LAB_0014f051;
    puVar8 = auStack_d0;
    uVar6 = 1;
    pcStack_e8 = (code *)0x14efc4;
    iVar2 = uv_poll_start(puVar8,1,socket_cb);
    if (iVar2 != 0) goto LAB_0014f056;
    pcStack_e8 = (code *)0x14efd8;
    puts("Going to run the loop in the child");
    pcStack_e8 = (code *)0x14efdd;
    puVar8 = (undefined1 *)uv_default_loop();
    uVar6 = 0;
    pcStack_e8 = (code *)0x14efe7;
    iVar2 = uv_run();
    if (iVar2 != 0) goto LAB_0014f05b;
    if (socket_cb_called == 1) goto LAB_0014eff4;
  }
  else {
    pcStack_e8 = (code *)0x14f038;
    run_test_fork_socketpair_cold_1();
LAB_0014f038:
    pcStack_e8 = (code *)0x14f03d;
    run_test_fork_socketpair_cold_2();
LAB_0014f03d:
    pcStack_e8 = (code *)0x14f042;
    run_test_fork_socketpair_cold_10();
LAB_0014f042:
    pcStack_e8 = (code *)0x14f047;
    run_test_fork_socketpair_cold_8();
LAB_0014f047:
    pcStack_e8 = (code *)0x14f04c;
    run_test_fork_socketpair_cold_9();
LAB_0014f04c:
    pcStack_e8 = (code *)0x14f051;
    run_test_fork_socketpair_cold_3();
LAB_0014f051:
    pcStack_e8 = (code *)0x14f056;
    run_test_fork_socketpair_cold_4();
LAB_0014f056:
    pcStack_e8 = (code *)0x14f05b;
    run_test_fork_socketpair_cold_5();
LAB_0014f05b:
    pcStack_e8 = (code *)0x14f060;
    run_test_fork_socketpair_cold_6();
  }
  pcStack_e8 = socket_cb;
  run_test_fork_socketpair_cold_7();
  socket_cb_called = socket_cb_called + 1;
  puStack_f0 = puVar4;
  pcStack_e8 = (code *)(ulong)uVar1;
  if (uVar6 == 0) {
    pcStack_100 = (code *)0x14f087;
    uVar6 = extraout_EDX;
    printf("Socket cb got events %d\n");
    puVar4 = puVar8;
    if ((extraout_EDX & 1) == 0) goto LAB_0014f0d3;
    if (socket_cb_read_fd == 0) {
LAB_0014f0be:
      uv_close(puVar8,0);
      return;
    }
    uVar6 = 0x2e0290;
    pcStack_100 = (code *)0x14f0ae;
    sVar3 = read(socket_cb_read_fd,socket_cb_read_buf,(ulong)socket_cb_read_size * 3);
    if (sVar3 == (ulong)socket_cb_read_size * 3) goto LAB_0014f0be;
  }
  else {
    pcStack_100 = (code *)0x14f0d3;
    socket_cb_cold_1();
LAB_0014f0d3:
    pcStack_100 = (code *)0x14f0d8;
    socket_cb_cold_3();
  }
  pcStack_100 = run_test_fork_socketpair_started;
  socket_cb_cold_2();
  pcStack_100 = (code *)puVar4;
  iVar2 = pipe(&iStack_1a8);
  if (iVar2 == 0) {
    run_timer_loop_once();
    uVar6 = 1;
    iVar2 = socketpair(1,1,0,&iStack_1b0);
    if (iVar2 != 0) goto LAB_0014f339;
    uVar5 = uv_default_loop();
    puVar4 = auStack_1a0;
    iVar2 = uv_poll_init(uVar5,puVar4,iStack_1b0);
    uVar6 = (uint)puVar4;
    if (iVar2 != 0) goto LAB_0014f33e;
    uVar6 = 1;
    iVar2 = uv_poll_start(auStack_1a0,1,socket_cb);
    if (iVar2 != 0) goto LAB_0014f343;
    uVar5 = uv_default_loop();
    uVar6 = 2;
    iVar2 = uv_run(uVar5);
    if (iVar2 != 1) goto LAB_0014f348;
    child_pid_01 = fork();
    if (child_pid_01 != 0) {
      if (child_pid_01 == -1) goto LAB_0014f352;
      iVar2 = uv_poll_stop(auStack_1a0);
      if (iVar2 != 0) goto LAB_0014f357;
      uv_close(auStack_1a0);
      uVar5 = uv_default_loop();
      uVar6 = 0;
      iVar2 = uv_run(uVar5);
      if (iVar2 != 0) goto LAB_0014f361;
      if (socket_cb_called != 0) goto LAB_0014f36b;
      uVar6 = 0x18323c;
      sVar3 = write(iStack_1a4,"1",1);
      if (sVar3 != 1) goto LAB_0014f375;
      uVar6 = 0x18271a;
      sVar3 = send(iStack_1ac,"hi\n",3,0);
      if (sVar3 != 3) goto LAB_0014f37f;
      uVar5 = uv_default_loop();
      uVar6 = 0;
      iVar2 = uv_run(uVar5);
      if (iVar2 == 0) {
        if (socket_cb_called != 0) goto LAB_0014f393;
        assert_wait_child(child_pid_01);
        goto LAB_0014f2f5;
      }
      goto LAB_0014f389;
    }
    uVar1 = getpid();
    printf("Child is %d\n",(ulong)uVar1);
    puVar4 = &uStack_1b1;
    sVar3 = read(iStack_1a8,puVar4,1);
    uVar6 = (uint)puVar4;
    if (sVar3 != 1) goto LAB_0014f35c;
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_fork(uVar5);
    if (iVar2 != 0) goto LAB_0014f366;
    if (socket_cb_called != 0) goto LAB_0014f370;
    puts("Going to run the loop in the child");
    socket_cb_read_fd = iStack_1b0;
    socket_cb_read_size = 1;
    uVar5 = uv_default_loop();
    uVar6 = 0;
    iVar2 = uv_run(uVar5);
    if (iVar2 != 0) goto LAB_0014f37a;
    if (socket_cb_called != 1) goto LAB_0014f384;
    uVar6 = 0x2e0290;
    printf("Buf %s\n");
    if (socket_cb_read_buf._0_4_ == 0xa6968) {
LAB_0014f2f5:
      uVar5 = uv_default_loop();
      uv_walk(uVar5,close_walk_cb,0);
      uVar6 = 0;
      uv_run(uVar5);
      uVar5 = uv_default_loop();
      iVar2 = uv_loop_close(uVar5);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_0014f34d;
    }
  }
  else {
    run_test_fork_socketpair_started_cold_1();
LAB_0014f339:
    run_test_fork_socketpair_started_cold_2();
LAB_0014f33e:
    run_test_fork_socketpair_started_cold_3();
LAB_0014f343:
    run_test_fork_socketpair_started_cold_4();
LAB_0014f348:
    run_test_fork_socketpair_started_cold_5();
LAB_0014f34d:
    run_test_fork_socketpair_started_cold_20();
LAB_0014f352:
    run_test_fork_socketpair_started_cold_12();
LAB_0014f357:
    run_test_fork_socketpair_started_cold_13();
LAB_0014f35c:
    run_test_fork_socketpair_started_cold_6();
LAB_0014f361:
    run_test_fork_socketpair_started_cold_14();
LAB_0014f366:
    run_test_fork_socketpair_started_cold_7();
LAB_0014f36b:
    run_test_fork_socketpair_started_cold_15();
LAB_0014f370:
    run_test_fork_socketpair_started_cold_8();
LAB_0014f375:
    run_test_fork_socketpair_started_cold_16();
LAB_0014f37a:
    run_test_fork_socketpair_started_cold_9();
LAB_0014f37f:
    run_test_fork_socketpair_started_cold_17();
LAB_0014f384:
    run_test_fork_socketpair_started_cold_10();
LAB_0014f389:
    run_test_fork_socketpair_started_cold_18();
  }
  run_test_fork_socketpair_started_cold_11();
LAB_0014f393:
  run_test_fork_socketpair_started_cold_19();
  fork_signal_cb_called = uVar6;
  uv_close();
  return;
}

Assistant:

static void assert_wait_child(pid_t child_pid) {
  pid_t waited_pid;
  int child_stat;

  waited_pid = waitpid(child_pid, &child_stat, 0);
  printf("Waited pid is %d with status %d\n", waited_pid, child_stat);
  if (waited_pid == -1) {
    perror("Failed to wait");
  }
  ASSERT(child_pid == waited_pid);
  ASSERT(WIFEXITED(child_stat)); /* Clean exit, not a signal. */
  ASSERT(!WIFSIGNALED(child_stat));
  ASSERT(0 == WEXITSTATUS(child_stat));
}